

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O2

int lws_alpn_comma_to_openssl(char *comma,uint8_t *os,int len)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  bool bVar5;
  
  iVar3 = (int)os;
  if (comma != (char *)0x0) {
    puVar2 = (uint8_t *)0x0;
    while( true ) {
      puVar4 = (uint8_t *)comma + 1;
      uVar1 = *comma;
      if ((uVar1 == '\0') || (len < 3)) break;
      comma = (char *)puVar4;
      if ((puVar2 == (uint8_t *)0x0) && (uVar1 == ' ')) {
        puVar2 = (uint8_t *)0x0;
      }
      else {
        bVar5 = puVar2 == (uint8_t *)0x0;
        if (bVar5) {
          puVar2 = os;
        }
        os = os + bVar5;
        len = len - (uint)bVar5;
        if (uVar1 == ',') {
          *puVar2 = ~(byte)puVar2 + (char)os;
          puVar2 = (uint8_t *)0x0;
        }
        else {
          *os = uVar1;
          os = os + 1;
          len = len + -1;
        }
      }
    }
    if (puVar2 != (uint8_t *)0x0) {
      *puVar2 = ~(byte)puVar2 + (char)os;
    }
    *os = '\0';
    return (int)os - iVar3;
  }
  return 0;
}

Assistant:

int
lws_alpn_comma_to_openssl(const char *comma, uint8_t *os, int len)
{
	uint8_t *oos = os, *plen = NULL;

	if (!comma)
		return 0;

	while (*comma && len > 2) {
		if (!plen && *comma == ' ') {
			comma++;
			continue;
		}
		if (!plen) {
			plen = os++;
			len--;
		}

		if (*comma == ',') {
			*plen = (uint8_t)lws_ptr_diff(os, plen + 1);
			plen = NULL;
			comma++;
		} else {
			*os++ = (uint8_t)*comma++;
			len--;
		}
	}

	if (plen)
		*plen = (uint8_t)lws_ptr_diff(os, plen + 1);

	*os = 0;

	return lws_ptr_diff(os, oos);
}